

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtPutNode_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t tupleExpression,
          sysbvm_tuple_t nameExpression,sysbvm_tuple_t valueExpression)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_astTupleSlotNamedAtPutNode_t *result;
  sysbvm_tuple_t valueExpression_local;
  sysbvm_tuple_t nameExpression_local;
  sysbvm_tuple_t tupleExpression_local;
  sysbvm_tuple_t sourcePosition_local;
  sysbvm_context_t *context_local;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).astTupleSlotNamedAtPutNodeType,7);
  (psVar1->field_1).pointers[0] = sourcePosition;
  psVar1[1].field_1.pointers[0] = tupleExpression;
  psVar1[2].header.field_0.typePointer = nameExpression;
  psVar1[2].header.identityHashAndFlags = (int)valueExpression;
  psVar1[2].header.objectSize = (int)(valueExpression >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astTupleSlotNamedAtPutNode_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t tupleExpression, sysbvm_tuple_t nameExpression, sysbvm_tuple_t valueExpression)
{
    sysbvm_astTupleSlotNamedAtPutNode_t *result = (sysbvm_astTupleSlotNamedAtPutNode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.astTupleSlotNamedAtPutNodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_astTupleSlotNamedAtPutNode_t));
    result->super.sourcePosition = sourcePosition;
    result->tupleExpression = tupleExpression;
    result->nameExpression = nameExpression;
    result->valueExpression = valueExpression;
    return (sysbvm_tuple_t)result;
}